

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fit-model-multi.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *ppMVar1;
  MatrixXf *pMVar2;
  Index *pIVar3;
  float *pfVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  float fVar6;
  float fVar7;
  pointer pcVar8;
  pointer pLVar9;
  void *pvVar10;
  pointer pMVar11;
  pointer pfVar12;
  pointer ppVar13;
  undefined8 uVar14;
  char *pcVar15;
  typed_value<boost::filesystem::path,_char> *ptVar16;
  typed_value<std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>,_char>
  *ptVar17;
  const_iterator cVar18;
  ostream *poVar19;
  ulong uVar20;
  basic_ostream<char,_std::char_traits<char>_> *pbVar21;
  int iVar22;
  pointer ppVar23;
  ulong uVar24;
  pointer pfVar25;
  Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *lm;
  Mesh *pMVar26;
  pointer pLVar27;
  pointer __args;
  pointer pMVar28;
  long lVar29;
  __m128 t_2;
  __m128 t_3;
  __m128 t;
  __m128 t_1;
  path mappingsfile;
  path contourfile;
  path modelfile;
  Mesh neutral_expression;
  Mat outimg;
  undefined4 uStack_ca4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c98;
  pointer pMStack_c88;
  undefined4 local_c80;
  undefined4 uStack_c7c;
  undefined4 uStack_c78;
  undefined4 uStack_c74;
  undefined4 uStack_c70;
  undefined4 local_c6c;
  pointer local_c68;
  pointer local_c60;
  pointer local_c50;
  pointer local_c48;
  pointer local_c38;
  pointer local_c30;
  pointer local_c20;
  void *local_c18;
  undefined8 uStack_c10;
  long local_c08;
  Matrix4f modelview_frontal;
  vector<cv::Mat,_std::allocator<cv::Mat>_> images;
  path outputfile;
  pointer local_b60;
  path outputfile_1;
  vector<float,_std::allocator<float>_> pca_shape_coefficients;
  vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
  per_frame_rendering_params;
  vector<int,_std::allocator<int>_> image_heights;
  vector<int,_std::allocator<int>_> image_widths;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> landmarksfiles;
  path outputfilebase;
  vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_> per_frame_meshes;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> imagefiles;
  Image4u frontal_rendering;
  int local_9d8;
  int local_9d4;
  int local_9d0;
  int local_9cc;
  Vector4f local_9c8;
  path blendshapesfile;
  path edgetopologyfile;
  vector<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
  per_frame_landmarks;
  Image4u frontal_rendering_1;
  vector<float,_std::allocator<float>_> local_920;
  vector<float,_std::allocator<float>_> local_908;
  vector<int,_std::allocator<int>_> local_8f0;
  Matrix4f modelview_frontal_1;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  vector<float,_std::allocator<float>_> local_798;
  vector<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
  fitted_image_points;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  blendshape_coefficients;
  ModelContour local_738;
  vector<float,_std::allocator<float>_> local_708;
  vector<int,_std::allocator<int>_> local_6f0;
  Scalar local_6d8;
  vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
  blendshapes;
  Mat merged_texturemap;
  long local_690 [10];
  EdgeTopology edge_topology;
  ContourLandmarks ibug_contour;
  Texture local_5e0;
  MorphableModel morphable_model;
  LandmarkMapper landmark_mapper;
  WeightedIsomapAveraging texturemap_averaging;
  Texture local_218;
  Mat local_1f8 [96];
  Matrix4f local_198;
  Matrix4f local_158;
  Matrix4f local_118;
  Matrix4f local_d8;
  optional<eos::fitting::RenderingParameters> local_98;
  
  modelfile.m_pathname._M_dataplus._M_p = (pointer)&modelfile.m_pathname.field_2;
  modelfile.m_pathname._M_string_length = 0;
  modelfile.m_pathname.field_2._M_local_buf[0] = '\0';
  mappingsfile.m_pathname._M_dataplus._M_p = (pointer)&mappingsfile.m_pathname.field_2;
  mappingsfile.m_pathname._M_string_length = 0;
  mappingsfile.m_pathname.field_2._M_local_buf[0] = '\0';
  contourfile.m_pathname._M_dataplus._M_p = (pointer)&contourfile.m_pathname.field_2;
  contourfile.m_pathname._M_string_length = 0;
  contourfile.m_pathname.field_2._M_local_buf[0] = '\0';
  edgetopologyfile.m_pathname._M_dataplus._M_p = (pointer)&edgetopologyfile.m_pathname.field_2;
  edgetopologyfile.m_pathname._M_string_length = 0;
  edgetopologyfile.m_pathname.field_2._M_local_buf[0] = '\0';
  blendshapesfile.m_pathname._M_dataplus._M_p = (pointer)&blendshapesfile.m_pathname.field_2;
  blendshapesfile.m_pathname._M_string_length = 0;
  blendshapesfile.m_pathname.field_2._M_local_buf[0] = '\0';
  outputfilebase.m_pathname._M_dataplus._M_p = (pointer)&outputfilebase.m_pathname.field_2;
  outputfilebase.m_pathname._M_string_length = 0;
  outputfilebase.m_pathname.field_2._M_local_buf[0] = '\0';
  imagefiles.super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imagefiles.super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  imagefiles.super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  landmarksfiles.
  super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  landmarksfiles.
  super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  landmarksfiles.
  super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar2 = &morphable_model.shape_model.orthonormal_pca_basis;
  morphable_model.shape_model.mean.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (float *)pMVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&morphable_model,"Allowed options","");
  boost::program_options::options_description::options_description
            ((options_description *)&texturemap_averaging,(string *)&morphable_model,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((MatrixXf *)
      morphable_model.shape_model.mean.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
      .m_storage.m_data != pMVar2) {
    operator_delete(morphable_model.shape_model.mean.
                    super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data,
                    (long)morphable_model.shape_model.orthonormal_pca_basis.
                          super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                          m_data + 1);
  }
  uVar14 = boost::program_options::options_description::add_options();
  modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[0] = (float)uVar14;
  modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[1] = (float)((ulong)uVar14 >> 0x20);
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              ((char *)&modelview_frontal_1,"help,h");
  ptVar16 = boost::program_options::value<boost::filesystem::path>(&modelfile);
  ptVar16->m_required = true;
  morphable_model.shape_model.mean.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (float *)pMVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&morphable_model,"../share/sfm_shape_3448.bin","");
  ptVar16 = boost::program_options::typed_value<boost::filesystem::path,_char>::default_value
                      (ptVar16,(path *)&morphable_model);
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar15,(value_semantic *)"model,m",(char *)ptVar16);
  ptVar17 = boost::program_options::
            value<std::vector<boost::filesystem::path,std::allocator<boost::filesystem::path>>>
                      (&imagefiles);
  ptVar17->m_multitoken = true;
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar15,(value_semantic *)"image,i",(char *)ptVar17);
  ptVar17 = boost::program_options::
            value<std::vector<boost::filesystem::path,std::allocator<boost::filesystem::path>>>
                      (&landmarksfiles);
  ptVar17->m_multitoken = true;
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar15,(value_semantic *)"landmarks,l",(char *)ptVar17);
  ptVar16 = boost::program_options::value<boost::filesystem::path>(&mappingsfile);
  ptVar16->m_required = true;
  neutral_expression.vertices.
  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&neutral_expression.vertices.
                 super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&neutral_expression,"../share/ibug_to_sfm.txt","");
  ptVar16 = boost::program_options::typed_value<boost::filesystem::path,_char>::default_value
                      (ptVar16,(path *)&neutral_expression);
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar15,(value_semantic *)"mapping,p",(char *)ptVar16);
  ptVar16 = boost::program_options::value<boost::filesystem::path>(&contourfile);
  ptVar16->m_required = true;
  _outimg = (uint)&local_c98;
  uStack_ca4 = (undefined4)((ulong)&local_c98 >> 0x20);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&outimg,"../share/model_contours.json","");
  ptVar16 = boost::program_options::typed_value<boost::filesystem::path,_char>::default_value
                      (ptVar16,(path *)&outimg);
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar15,(value_semantic *)"model-contour,c",(char *)ptVar16);
  ptVar16 = boost::program_options::value<boost::filesystem::path>(&edgetopologyfile);
  ptVar16->m_required = true;
  _merged_texturemap = local_690;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&merged_texturemap,"../share/sfm_3448_edge_topology.json","");
  ptVar16 = boost::program_options::typed_value<boost::filesystem::path,_char>::default_value
                      (ptVar16,(path *)&merged_texturemap);
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar15,(value_semantic *)"edge-topology,e",(char *)ptVar16);
  ptVar16 = boost::program_options::value<boost::filesystem::path>(&blendshapesfile);
  ptVar16->m_required = true;
  modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array._0_8_ = modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                m_storage.m_data.array + 4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&modelview_frontal,"../share/expression_blendshapes_3448.bin","");
  ptVar16 = boost::program_options::typed_value<boost::filesystem::path,_char>::default_value
                      (ptVar16,(path *)&modelview_frontal);
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar15,(value_semantic *)"blendshapes,b",(char *)ptVar16);
  ptVar16 = boost::program_options::value<boost::filesystem::path>(&outputfilebase);
  ptVar16->m_required = true;
  frontal_rendering._0_8_ = &frontal_rendering.data_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&frontal_rendering,"out","");
  ptVar16 = boost::program_options::typed_value<boost::filesystem::path,_char>::default_value
                      (ptVar16,(path *)&frontal_rendering);
  boost::program_options::options_description_easy_init::operator()
            (pcVar15,(value_semantic *)"output,o",(char *)ptVar16);
  if ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)frontal_rendering._0_8_ !=
      &frontal_rendering.data_) {
    operator_delete((void *)frontal_rendering._0_8_,
                    (ulong)(frontal_rendering.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1));
  }
  if ((float *)modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
               m_storage.m_data.array._0_8_ !=
      modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
      .array + 4) {
    operator_delete((void *)modelview_frontal.
                            super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                            m_data.array._0_8_,
                    CONCAT44(modelview_frontal.
                             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                             m_data.array[5],
                             modelview_frontal.
                             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                             m_data.array[4]) + 1);
  }
  if (_merged_texturemap != local_690) {
    operator_delete(_merged_texturemap,local_690[0] + 1);
  }
  ppMVar1 = &neutral_expression.vertices.
             super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(uStack_ca4,_outimg) != &local_c98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(uStack_ca4,_outimg),
                    CONCAT44(local_c98._M_allocated_capacity._4_4_,
                             local_c98._M_allocated_capacity._0_4_) + 1);
  }
  if (neutral_expression.vertices.
      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppMVar1) {
    operator_delete(neutral_expression.vertices.
                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)((neutral_expression.vertices.
                                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                                  m_storage.m_data.array + 1));
  }
  if ((MatrixXf *)
      morphable_model.shape_model.mean.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
      .m_storage.m_data != pMVar2) {
    operator_delete(morphable_model.shape_model.mean.
                    super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data,
                    (long)morphable_model.shape_model.orthonormal_pca_basis.
                          super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                          m_data + 1);
  }
  boost::program_options::variables_map::variables_map((variables_map *)&morphable_model);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&neutral_expression,argc,argv);
  boost::program_options::detail::cmdline::set_options_description
            ((options_description *)&neutral_expression);
  neutral_expression.tci.
  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&texturemap_averaging;
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)&outimg,
             (basic_command_line_parser<char> *)&neutral_expression);
  boost::program_options::store
            ((basic_parsed_options *)&outimg,(variables_map *)&morphable_model,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&outimg);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1((function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                *)&neutral_expression.tvi.
                   super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&neutral_expression.texcoords);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&neutral_expression);
  neutral_expression.vertices.
  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&neutral_expression,"help","");
  pMVar2 = &morphable_model.shape_model.orthonormal_pca_basis;
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)pMVar2,(key_type *)&neutral_expression);
  pIVar3 = &morphable_model.shape_model.orthonormal_pca_basis.
            super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  if (neutral_expression.vertices.
      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppMVar1) {
    operator_delete(neutral_expression.vertices.
                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)((neutral_expression.vertices.
                                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                                  m_storage.m_data.array + 1));
  }
  if (cVar18._M_node == (_Base_ptr)pIVar3) {
    boost::program_options::notify((variables_map *)&morphable_model);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage: fit-model-multi [options]",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    boost::program_options::operator<<
              ((ostream *)&std::cout,(options_description *)&texturemap_averaging);
  }
  morphable_model.shape_model.mean.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (float *)std::ostream::_M_insert<unsigned_long>;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&morphable_model.color_model.mean.
                  super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&morphable_model.shape_model.eigenvalues);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               *)pMVar2);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector((vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
             *)&texturemap_averaging.field_0x68);
  if (texturemap_averaging._64_8_ != 0) {
    operator_delete((void *)texturemap_averaging._64_8_,
                    texturemap_averaging._96_8_ - texturemap_averaging._64_8_);
    texturemap_averaging._64_8_ = 0;
    texturemap_averaging._72_4_ = 0;
    texturemap_averaging._80_8_ = 0;
    texturemap_averaging._88_4_ = 0;
    texturemap_averaging.merged_isomap = (Mat)0x0;
    texturemap_averaging._97_7_ = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector((vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
             *)&texturemap_averaging.field_0x28);
  if ((undefined1 *)texturemap_averaging._0_8_ != &texturemap_averaging.field_0x10) {
    operator_delete((void *)texturemap_averaging._0_8_,texturemap_averaging._16_8_ + 1);
  }
  ppVar13 = imagefiles.
            super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  iVar22 = 0;
  if (cVar18._M_node == (_Base_ptr)pIVar3) {
    if ((long)landmarksfiles.
              super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)landmarksfiles.
              super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
              _M_impl.super__Vector_impl_data._M_start ==
        (long)imagefiles.
              super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)imagefiles.
              super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
              _M_impl.super__Vector_impl_data._M_start) {
      if (landmarksfiles.
          super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          landmarksfiles.
          super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if (imagefiles.
            super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            imagefiles.
            super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          ppVar23 = imagefiles.
                    super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            cv::imread((string *)&morphable_model,(int)ppVar23);
            std::vector<cv::Mat,_std::allocator<cv::Mat>_>::emplace_back<cv::Mat>
                      (&images,(Mat *)&morphable_model);
            cv::Mat::~Mat((Mat *)&morphable_model);
            ppVar23 = ppVar23 + 1;
          } while (ppVar23 != ppVar13);
        }
        ppVar13 = landmarksfiles.
                  super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        per_frame_landmarks.
        super__Vector_base<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        per_frame_landmarks.
        super__Vector_base<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        per_frame_landmarks.
        super__Vector_base<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (landmarksfiles.
            super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            landmarksfiles.
            super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          ppVar23 = landmarksfiles.
                    super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            pcVar8 = (ppVar23->m_pathname)._M_dataplus._M_p;
            local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_7b8,pcVar8,pcVar8 + (ppVar23->m_pathname)._M_string_length);
            eos::core::read_pts_landmarks
                      ((LandmarkCollection<Eigen::Vector2f> *)&morphable_model,&local_7b8);
            std::
            vector<std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>,std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>>>
            ::
            emplace_back<std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>>
                      ((vector<std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>,std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>>>
                        *)&per_frame_landmarks,
                       (vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                        *)&morphable_model);
            std::
            vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
            ::~vector((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                       *)&morphable_model);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
              operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1
                             );
            }
            ppVar23 = ppVar23 + 1;
          } while (ppVar23 != ppVar13);
        }
        morphable_model.expression_model.
        super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
        ._M_engaged = false;
        morphable_model.landmark_definitions.
        super__Optional_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
        ._M_engaged = false;
        memset(&morphable_model,0,0xd0);
        morphable_model.texture_coordinates.
        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        morphable_model.texture_coordinates.
        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        morphable_model.texture_coordinates.
        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        morphable_model.texture_triangle_indices.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        morphable_model.texture_triangle_indices.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        morphable_model.texture_triangle_indices.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7d8,modelfile.m_pathname._M_dataplus._M_p,
                   modelfile.m_pathname._M_dataplus._M_p + modelfile.m_pathname._M_string_length);
        eos::morphablemodel::load_model((MorphableModel *)&texturemap_averaging,&local_7d8);
        eos::morphablemodel::MorphableModel::operator=
                  (&morphable_model,(MorphableModel *)&texturemap_averaging);
        eos::morphablemodel::MorphableModel::~MorphableModel
                  ((MorphableModel *)&texturemap_averaging);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
          operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
        }
        if (mappingsfile.m_pathname._M_string_length == 0) {
          landmark_mapper.landmark_mappings._M_h._M_buckets =
               &landmark_mapper.landmark_mappings._M_h._M_single_bucket;
          landmark_mapper.landmark_mappings._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          landmark_mapper.landmark_mappings._M_h._M_element_count = 0;
          landmark_mapper.landmark_mappings._M_h._M_bucket_count = 1;
          landmark_mapper.landmark_mappings._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          landmark_mapper.landmark_mappings._M_h._M_rehash_policy._4_4_ = 0;
          landmark_mapper.landmark_mappings._M_h._M_rehash_policy._M_next_resize = 0;
          landmark_mapper.landmark_mappings._M_h._M_single_bucket = (__node_base_ptr)0x0;
        }
        else {
          local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_7f8,mappingsfile.m_pathname._M_dataplus._M_p,
                     mappingsfile.m_pathname._M_dataplus._M_p +
                     mappingsfile.m_pathname._M_string_length);
          eos::core::LandmarkMapper::LandmarkMapper(&landmark_mapper,&local_7f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
            operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
          }
        }
        local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_818,blendshapesfile.m_pathname._M_dataplus._M_p,
                   blendshapesfile.m_pathname._M_dataplus._M_p +
                   blendshapesfile.m_pathname._M_string_length);
        eos::morphablemodel::load_blendshapes(&blendshapes,&local_818);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_818._M_dataplus._M_p != &local_818.field_2) {
          operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
        }
        if (contourfile.m_pathname._M_string_length == 0) {
          local_738.left_contour.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_738.left_contour.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_738.right_contour.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_738.left_contour.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_738.right_contour.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_738.right_contour.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
        }
        else {
          local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_838,contourfile.m_pathname._M_dataplus._M_p,
                     contourfile.m_pathname._M_dataplus._M_p +
                     contourfile.m_pathname._M_string_length);
          eos::fitting::ModelContour::load(&local_738,&local_838);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_838._M_dataplus._M_p != &local_838.field_2) {
            operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
          }
        }
        local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_858,mappingsfile.m_pathname._M_dataplus._M_p,
                   mappingsfile.m_pathname._M_dataplus._M_p +
                   mappingsfile.m_pathname._M_string_length);
        eos::fitting::ContourLandmarks::load(&ibug_contour,&local_858);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_858._M_dataplus._M_p != &local_858.field_2) {
          operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
        }
        local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_878,edgetopologyfile.m_pathname._M_dataplus._M_p,
                   edgetopologyfile.m_pathname._M_dataplus._M_p +
                   edgetopologyfile.m_pathname._M_string_length);
        eos::morphablemodel::load_edge_topology(&edge_topology,&local_878);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_878._M_dataplus._M_p != &local_878.field_2) {
          operator_delete(local_878._M_dataplus._M_p,local_878.field_2._M_allocated_capacity + 1);
        }
        pMVar11 = images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        per_frame_meshes.super__Vector_base<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        per_frame_meshes.super__Vector_base<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        per_frame_meshes.super__Vector_base<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        per_frame_rendering_params.
        super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        per_frame_rendering_params.
        super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        per_frame_rendering_params.
        super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        image_widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        image_widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        image_widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        if (images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_start !=
            images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          __args = images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start + 0xc;
          do {
            if (image_widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                image_widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&image_widths,
                         (iterator)
                         image_widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)__args);
            }
            else {
              *image_widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = *(int *)__args;
              image_widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   image_widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&image_heights,
                         (iterator)
                         image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)(__args + -4));
            }
            else {
              *image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = *(int *)(__args + -4);
              image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            pMVar28 = __args + 0x54;
            __args = __args + 0x60;
          } while (pMVar28 != pMVar11);
        }
        pca_shape_coefficients.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pca_shape_coefficients.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pca_shape_coefficients.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        blendshape_coefficients.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        blendshape_coefficients.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        blendshape_coefficients.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        fitted_image_points.
        super__Vector_base<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        fitted_image_points.
        super__Vector_base<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        fitted_image_points.
        super__Vector_base<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::vector(&local_8f0,&image_widths);
        std::vector<int,_std::allocator<int>_>::vector(&local_6f0,&image_heights);
        local_98.super__Optional_base<eos::fitting::RenderingParameters,_false,_false>._M_payload.
        super__Optional_payload_base<eos::fitting::RenderingParameters>._M_engaged = false;
        eos::fitting::fit_shape_and_pose
                  ((pair<std::vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>,_std::vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>_>
                    *)&texturemap_averaging,&morphable_model,&blendshapes,&per_frame_landmarks,
                   &landmark_mapper,&local_8f0,&local_6f0,&edge_topology,&ibug_contour,&local_738,5,
                   (optional<int>)0x0,30.0,&local_98,&pca_shape_coefficients,
                   &blendshape_coefficients,&fitted_image_points);
        neutral_expression.vertices.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)per_frame_meshes.
                      super__Vector_base<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
        neutral_expression.vertices.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)per_frame_meshes.
                      super__Vector_base<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>._M_impl.
                      super__Vector_impl_data._M_finish;
        neutral_expression.vertices.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)per_frame_meshes.
                      super__Vector_base<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>._M_impl.
                      super__Vector_impl_data._M_start;
        per_frame_meshes.super__Vector_base<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)texturemap_averaging._0_8_;
        per_frame_meshes.super__Vector_base<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)texturemap_averaging._8_8_;
        per_frame_meshes.super__Vector_base<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)texturemap_averaging._16_8_;
        texturemap_averaging.visibility_counter = (Mat)0x0;
        texturemap_averaging._1_7_ = 0;
        texturemap_averaging._8_8_ = 0;
        texturemap_averaging._16_8_ = 0;
        std::vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>::~vector
                  ((vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_> *)&neutral_expression)
        ;
        std::
        vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
        ::_M_move_assign(&per_frame_rendering_params,&texturemap_averaging.field_0x18);
        if (texturemap_averaging._24_8_ != 0) {
          operator_delete((void *)texturemap_averaging._24_8_,
                          texturemap_averaging._40_8_ - texturemap_averaging._24_8_);
        }
        std::vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>::~vector
                  ((vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_> *)
                   &texturemap_averaging);
        if (local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_8f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_8f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_8f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_8f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Final pca shape coefficients: ",0x1e);
        pfVar12 = pca_shape_coefficients.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (pca_shape_coefficients.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start !=
            pca_shape_coefficients.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pfVar25 = pca_shape_coefficients.super__Vector_base<float,_std::allocator<float>_>._M_impl
                    .super__Vector_impl_data._M_start;
          do {
            poVar19 = std::ostream::_M_insert<double>((double)*pfVar25);
            texturemap_averaging.visibility_counter = (Mat)0x20;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar19,(char *)&texturemap_averaging,1);
            pfVar25 = pfVar25 + 1;
          } while (pfVar25 != pfVar12);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
        std::ostream::put(-0x78);
        std::ostream::flush();
        WeightedIsomapAveraging::WeightedIsomapAveraging(&texturemap_averaging,60.0);
        cv::Mat::Mat(&merged_texturemap);
        if (images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar24 = 0;
          do {
            eos::fitting::RenderingParameters::get_yaw_pitch_roll
                      ((RenderingParameters *)&neutral_expression);
            pMVar26 = per_frame_meshes.
                      super__Vector_base<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar24;
            eos::fitting::RenderingParameters::get_modelview
                      (&local_d8,
                       per_frame_rendering_params.
                       super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar24);
            eos::fitting::RenderingParameters::get_projection
                      (&local_118,
                       per_frame_rendering_params.
                       super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar24);
            lVar29 = uVar24 * 0x60;
            eos::core::from_mat_with_alpha
                      ((Image4u *)&neutral_expression,
                       images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar29);
            eos::render::extract_texture
                      ((Image4u *)&outputfile,pMVar26,&local_d8,&local_118,Orthographic,
                       (Image4u *)&neutral_expression,0x200);
            if (neutral_expression.vertices.
                super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              operator_delete(neutral_expression.vertices.
                              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)neutral_expression.colors.
                                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)neutral_expression.vertices.
                                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            cv::Mat::clone();
            pLVar9 = per_frame_landmarks.
                     super__Vector_base<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar24].
                     super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pLVar27 = per_frame_landmarks.
                           super__Vector_base<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar24].
                           super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pLVar27 != pLVar9;
                pLVar27 = pLVar27 + 1) {
              modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
              m_storage.m_data.array[4] = 0.0;
              modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
              m_storage.m_data.array[5] = 0.0;
              modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
              m_storage.m_data.array[0] = 3.7909693e-37;
              modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
              m_storage.m_data.array._8_8_ = &outimg;
              fVar6 = (pLVar27->coordinates).
                      super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                      array[0];
              fVar7 = (pLVar27->coordinates).
                      super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                      array[1];
              local_9d0 = (int)ROUND(fVar6 + -2.0);
              local_9cc = (int)ROUND(fVar7 + -2.0);
              local_9d8 = (int)ROUND(fVar6 + 2.0);
              local_9d4 = (int)ROUND(fVar7 + 2.0);
              neutral_expression.vertices.
              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x406fe00000000000;
              neutral_expression.vertices.
              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              neutral_expression.vertices.
              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              neutral_expression.colors.
              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              cv::rectangle(&modelview_frontal,&local_9d0,&local_9d8,&neutral_expression,1,8,0);
            }
            cv::Mat::Mat(local_1f8,&outimg);
            pMVar26 = per_frame_meshes.
                      super__Vector_base<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar24;
            eos::fitting::RenderingParameters::get_modelview
                      (&local_158,
                       per_frame_rendering_params.
                       super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar24);
            eos::fitting::RenderingParameters::get_projection
                      (&local_198,
                       per_frame_rendering_params.
                       super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar24);
            local_9c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[1] = (float)*(int *)(images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar29 + 8);
            local_9c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[2] = (float)*(int *)(images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar29 + 0xc);
            local_9c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[3] = (float)-*(int *)(images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar29 + 8);
            local_9c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[0] = 0.0;
            local_6d8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.0;
            local_6d8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 255.0;
            local_6d8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
            local_6d8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 255.0;
            eos::render::draw_wireframe
                      (local_1f8,pMVar26,&local_158,&local_198,&local_9c8,&local_6d8);
            cv::Mat::~Mat(local_1f8);
            outputfile_1.m_pathname._M_dataplus._M_p = (pointer)&outputfile_1.m_pathname.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&outputfile_1,outputfilebase.m_pathname._M_dataplus._M_p,
                       outputfilebase.m_pathname._M_dataplus._M_p +
                       outputfilebase.m_pathname._M_string_length);
            boost::filesystem::path::stem();
            std::__cxx11::string::_M_append
                      ((char *)&outputfile_1,
                       (ulong)neutral_expression.vertices.
                              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            pfVar4 = modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array + 4;
            if (neutral_expression.vertices.
                super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pointer)&neutral_expression.vertices.
                          super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(neutral_expression.vertices.
                              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (ulong)((long)((neutral_expression.vertices.
                                              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                                            ).m_storage.m_data.array + 1));
            }
            neutral_expression.vertices.
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)&neutral_expression.vertices.
                           super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::_M_construct<char_const*>((string *)&neutral_expression,".png","")
            ;
            std::__cxx11::string::_M_append
                      ((char *)&outputfile_1,
                       (ulong)neutral_expression.vertices.
                              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            if (neutral_expression.vertices.
                super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pointer)&neutral_expression.vertices.
                          super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(neutral_expression.vertices.
                              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (ulong)((long)((neutral_expression.vertices.
                                              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                                            ).m_storage.m_data.array + 1));
            }
            neutral_expression.vertices.
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            neutral_expression.vertices.
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(neutral_expression.vertices.
                                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,0x1010000);
            neutral_expression.vertices.
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)&outimg;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[4] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[5] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[0] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[1] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[2] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[3] = 0.0;
            cv::imwrite((string *)&outputfile_1,(_InputArray *)&neutral_expression,
                        (vector *)&modelview_frontal);
            pvVar10 = (void *)CONCAT44(modelview_frontal.
                                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                       m_storage.m_data.array[1],
                                       modelview_frontal.
                                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                       m_storage.m_data.array[0]);
            if (pvVar10 != (void *)0x0) {
              operator_delete(pvVar10,CONCAT44(modelview_frontal.
                                               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                               .m_storage.m_data.array[5],
                                               modelview_frontal.
                                               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                               .m_storage.m_data.array[4]) - (long)pvVar10);
            }
            modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[0] = 1.0;
            modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[1] = 0.0;
            modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[2] = 0.0;
            modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[3] = 0.0;
            modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[4] = 0.0;
            modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[5] = 1.0;
            modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[6] = 0.0;
            modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[7] = 0.0;
            modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[8] = 0.0;
            modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[9] = 0.0;
            modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[10] = 1.0;
            modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[0xb] = 0.0;
            modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[0xc] = 0.0;
            modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[0xd] = 0.0;
            modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[0xe] = 0.0;
            modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[0xf] = 1.0;
            std::vector<float,_std::allocator<float>_>::vector(&local_708,&pca_shape_coefficients);
            eos::morphablemodel::PcaModel::draw_sample
                      ((PcaModel *)&frontal_rendering,
                       (vector<float,_std::allocator<float>_> *)&morphable_model);
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[0] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[1] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[2] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[3] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[4] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[5] = 0.0;
            eos::morphablemodel::sample_to_mesh
                      (&neutral_expression,(VectorXf *)&frontal_rendering,
                       &morphable_model.color_model.mean,&morphable_model.shape_model.triangle_list,
                       &morphable_model.color_model.triangle_list,
                       &morphable_model.texture_coordinates,
                       (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                       &modelview_frontal);
            pvVar10 = (void *)CONCAT44(modelview_frontal.
                                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                       m_storage.m_data.array[1],
                                       modelview_frontal.
                                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                       m_storage.m_data.array[0]);
            if (pvVar10 != (void *)0x0) {
              operator_delete(pvVar10,CONCAT44(modelview_frontal.
                                               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                               .m_storage.m_data.array[5],
                                               modelview_frontal.
                                               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                               .m_storage.m_data.array[4]) - (long)pvVar10);
            }
            free((void *)frontal_rendering._0_8_);
            if (local_708.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_708.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_708.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_708.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[1] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[2] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[3] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[4] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[6] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[7] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[8] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[9] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[0xb] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[0xe] = 0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[0xf] = 1.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[0] = 0.0076923077;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[5] = 0.0076923077;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[10] = -1.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[0xc] = -0.0;
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[0xd] = -0.0;
            eos::render::create_mipmapped_texture(&local_218,(Image4u *)&outputfile,0);
            eos::render::render(&frontal_rendering_1,&neutral_expression,&modelview_frontal_1,
                                &modelview_frontal,0x100,0x100,&local_218,true,false,false);
            std::
            vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
            ::~vector(&local_218.mipmaps);
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array._0_8_ = pfVar4;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&modelview_frontal,".frontal.png","");
            boost::filesystem::path::replace_extension(&outputfile_1);
            if ((float *)modelview_frontal.
                         super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                         m_data.array._0_8_ != pfVar4) {
              operator_delete((void *)modelview_frontal.
                                      super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                      m_storage.m_data.array._0_8_,
                              CONCAT44(modelview_frontal.
                                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                       m_storage.m_data.array[5],
                                       modelview_frontal.
                                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                       m_storage.m_data.array[4]) + 1);
            }
            eos::core::to_mat((core *)&modelview_frontal,&frontal_rendering_1);
            frontal_rendering.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            frontal_rendering.height_ = 0x1010000;
            local_c08 = 0;
            local_c18 = (void *)0x0;
            uStack_c10 = 0;
            frontal_rendering._8_8_ = (core *)&modelview_frontal;
            cv::imwrite((string *)&outputfile_1,(_InputArray *)&frontal_rendering,
                        (vector *)&local_c18);
            if (local_c18 != (void *)0x0) {
              operator_delete(local_c18,local_c08 - (long)local_c18);
            }
            cv::Mat::~Mat((Mat *)&modelview_frontal);
            modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array._0_8_ = pfVar4;
            std::__cxx11::string::_M_construct<char_const*>((string *)&modelview_frontal,"");
            boost::filesystem::path::replace_extension(&outputfile_1);
            if ((float *)modelview_frontal.
                         super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                         m_data.array._0_8_ != pfVar4) {
              operator_delete((void *)modelview_frontal.
                                      super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                      m_storage.m_data.array._0_8_,
                              CONCAT44(modelview_frontal.
                                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                       m_storage.m_data.array[5],
                                       modelview_frontal.
                                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                       m_storage.m_data.array[4]) + 1);
            }
            eos::core::to_mat((core *)&modelview_frontal,(Image4u *)&outputfile);
            frontal_rendering._0_8_ = &frontal_rendering.data_;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&frontal_rendering,".texture.png","");
            boost::filesystem::path::replace_extension(&outputfile_1);
            if ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)frontal_rendering._0_8_ !=
                &frontal_rendering.data_) {
              operator_delete((void *)frontal_rendering._0_8_,
                              (ulong)(frontal_rendering.data_.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
            }
            frontal_rendering.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            frontal_rendering.height_ = 0x1010000;
            local_c08 = 0;
            local_c18 = (void *)0x0;
            uStack_c10 = 0;
            frontal_rendering._8_8_ = (core *)&modelview_frontal;
            cv::imwrite((string *)&outputfile_1,(_InputArray *)&frontal_rendering,
                        (vector *)&local_c18);
            if (local_c18 != (void *)0x0) {
              operator_delete(local_c18,local_c08 - (long)local_c18);
            }
            WeightedIsomapAveraging::add_and_merge
                      ((WeightedIsomapAveraging *)&frontal_rendering,
                       &texturemap_averaging.visibility_counter);
            cv::Mat::operator=(&merged_texturemap,(Mat *)&frontal_rendering);
            cv::Mat::~Mat((Mat *)&frontal_rendering);
            cv::Mat::~Mat((Mat *)&modelview_frontal);
            if (frontal_rendering_1.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(frontal_rendering_1.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)frontal_rendering_1.data_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)frontal_rendering_1.data_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (neutral_expression.tti.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(neutral_expression.tti.
                              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)neutral_expression.tti.
                                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)neutral_expression.tti.
                                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (neutral_expression.tci.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(neutral_expression.tci.
                              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)neutral_expression.tci.
                                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)neutral_expression.tci.
                                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (neutral_expression.tvi.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(neutral_expression.tvi.
                              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)neutral_expression.tvi.
                                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)neutral_expression.tvi.
                                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (neutral_expression.texcoords.
                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(neutral_expression.texcoords.
                              super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)neutral_expression.texcoords.
                                    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)neutral_expression.texcoords.
                                    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (neutral_expression.colors.
                super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(neutral_expression.colors.
                              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)neutral_expression.colors.
                                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)neutral_expression.colors.
                                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (neutral_expression.vertices.
                super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(neutral_expression.vertices.
                              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)neutral_expression.vertices.
                                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)neutral_expression.vertices.
                                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)outputfile_1.m_pathname._M_dataplus._M_p != &outputfile_1.m_pathname.field_2) {
              operator_delete(outputfile_1.m_pathname._M_dataplus._M_p,
                              outputfile_1.m_pathname.field_2._M_allocated_capacity + 1);
            }
            cv::Mat::~Mat(&outimg);
            if (outputfile.m_pathname.field_2._M_allocated_capacity != 0) {
              operator_delete((void *)outputfile.m_pathname.field_2._M_allocated_capacity,
                              (long)local_b60 - outputfile.m_pathname.field_2._0_8_);
            }
            uVar24 = (ulong)((int)uVar24 + 1);
            uVar20 = ((long)images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
          } while (uVar24 <= uVar20 && uVar20 - uVar24 != 0);
        }
        paVar5 = &outputfile.m_pathname.field_2;
        outputfile.m_pathname._M_dataplus._M_p = (pointer)paVar5;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&outputfile,outputfilebase.m_pathname._M_dataplus._M_p,
                   outputfilebase.m_pathname._M_dataplus._M_p +
                   outputfilebase.m_pathname._M_string_length);
        neutral_expression.vertices.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&neutral_expression.vertices.
                       super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&neutral_expression,"merged.texture.png","");
        std::__cxx11::string::_M_append
                  ((char *)&outputfile,
                   (ulong)neutral_expression.vertices.
                          super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        if (neutral_expression.vertices.
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&neutral_expression.vertices.
                      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(neutral_expression.vertices.
                          super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)((neutral_expression.vertices.
                                          super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                        super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>)
                                        .m_storage.m_data.array + 1));
        }
        neutral_expression.vertices.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        neutral_expression.vertices.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(neutral_expression.vertices.
                               super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0x1010000);
        neutral_expression.vertices.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)&merged_texturemap;
        local_c98._M_allocated_capacity._0_4_ = 0;
        local_c98._M_allocated_capacity._4_4_ = 0;
        _outimg = 0;
        cv::imwrite((string *)&outputfile,(_InputArray *)&neutral_expression,(vector *)&outimg);
        pvVar10 = (void *)(ulong)_outimg;
        if (pvVar10 != (void *)0x0) {
          operator_delete(pvVar10,CONCAT44(local_c98._M_allocated_capacity._4_4_,
                                           local_c98._M_allocated_capacity._0_4_) - (long)pvVar10);
        }
        neutral_expression.vertices.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&neutral_expression.vertices.
                       super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>((string *)&neutral_expression,"");
        boost::filesystem::path::replace_extension(&outputfile);
        if (neutral_expression.vertices.
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&neutral_expression.vertices.
                      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(neutral_expression.vertices.
                          super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)((neutral_expression.vertices.
                                          super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                        super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>)
                                        .m_storage.m_data.array + 1));
        }
        modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[0] = 1.0;
        modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[1] = 0.0;
        modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[2] = 0.0;
        modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[3] = 0.0;
        modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[4] = 0.0;
        modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[5] = 1.0;
        modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[6] = 0.0;
        modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[7] = 0.0;
        modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[8] = 0.0;
        modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[9] = 0.0;
        modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[10] = 1.0;
        modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[0xb] = 0.0;
        modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[0xc] = 0.0;
        modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[0xd] = 0.0;
        modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[0xe] = 0.0;
        modelview_frontal.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[0xf] = 1.0;
        std::vector<float,_std::allocator<float>_>::vector(&local_908,&pca_shape_coefficients);
        eos::morphablemodel::PcaModel::draw_sample
                  ((PcaModel *)&frontal_rendering,
                   (vector<float,_std::allocator<float>_> *)&morphable_model);
        _outimg = 0;
        local_c98._M_allocated_capacity._0_4_ = 0;
        local_c98._M_allocated_capacity._4_4_ = 0;
        eos::morphablemodel::sample_to_mesh
                  (&neutral_expression,(VectorXf *)&frontal_rendering,
                   &morphable_model.color_model.mean,&morphable_model.shape_model.triangle_list,
                   &morphable_model.color_model.triangle_list,&morphable_model.texture_coordinates,
                   (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)&outimg);
        pvVar10 = (void *)(ulong)_outimg;
        if (pvVar10 != (void *)0x0) {
          operator_delete(pvVar10,CONCAT44(local_c98._M_allocated_capacity._4_4_,
                                           local_c98._M_allocated_capacity._0_4_) - (long)pvVar10);
        }
        free((void *)frontal_rendering._0_8_);
        if (local_908.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_908.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_908.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_908.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        local_c98._M_allocated_capacity._0_4_ = 0;
        local_c98._8_8_ = (void *)0x0;
        pMStack_c88 = (pointer)0x0;
        uStack_c7c = 0;
        uStack_c70 = 0;
        local_c6c = 0x3f800000;
        _outimg = 0x3bfc0fc1;
        local_c98._M_allocated_capacity._4_4_ = 0x3bfc0fc1;
        local_c80 = 0xbf800000;
        uStack_c78 = 0x80000000;
        uStack_c74 = 0x80000000;
        eos::core::from_mat_with_alpha((Image4u *)&modelview_frontal_1,&merged_texturemap);
        eos::render::create_mipmapped_texture(&local_5e0,(Image4u *)&modelview_frontal_1,0);
        eos::render::render(&frontal_rendering,&neutral_expression,&modelview_frontal,
                            (Matrix4f *)&outimg,0x200,0x200,&local_5e0,true,false,false);
        std::
        vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
        ::~vector(&local_5e0.mipmaps);
        pvVar10 = (void *)CONCAT44(modelview_frontal_1.
                                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                   m_storage.m_data.array[5],
                                   modelview_frontal_1.
                                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                   m_storage.m_data.array[4]);
        if (pvVar10 != (void *)0x0) {
          operator_delete(pvVar10,modelview_frontal_1.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array._32_8_ - (long)pvVar10);
        }
        _outimg = (uint)&local_c98;
        uStack_ca4 = (undefined4)((ulong)&local_c98 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)&outimg,".frontal.png","");
        boost::filesystem::path::replace_extension(&outputfile);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_ca4,_outimg) != &local_c98) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_ca4,_outimg),
                          CONCAT44(local_c98._M_allocated_capacity._4_4_,
                                   local_c98._M_allocated_capacity._0_4_) + 1);
        }
        eos::core::to_mat((core *)&outimg,&frontal_rendering);
        modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[4] = 0.0;
        modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[5] = 0.0;
        modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array[0] = 2.3693558e-38;
        frontal_rendering_1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        frontal_rendering_1.height_ = 0;
        frontal_rendering_1.width_ = 0;
        frontal_rendering_1.row_stride = 0;
        frontal_rendering_1._12_4_ = 0;
        modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
        m_data.array._8_8_ = (core *)&outimg;
        cv::imwrite((string *)&outputfile,(_InputArray *)&modelview_frontal_1,
                    (vector *)&frontal_rendering_1);
        if (frontal_rendering_1._0_8_ != 0) {
          operator_delete((void *)frontal_rendering_1._0_8_,
                          (long)frontal_rendering_1.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start - frontal_rendering_1._0_8_
                         );
        }
        cv::Mat::~Mat(&outimg);
        _outimg = (uint)&local_c98;
        uStack_ca4 = (undefined4)((ulong)&local_c98 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)&outimg,"");
        boost::filesystem::path::replace_extension(&outputfile);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_ca4,_outimg) != &local_c98) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_ca4,_outimg),
                          CONCAT44(local_c98._M_allocated_capacity._4_4_,
                                   local_c98._M_allocated_capacity._0_4_) + 1);
        }
        _outimg = (uint)&local_c98;
        uStack_ca4 = (undefined4)((ulong)&local_c98 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)&outimg,".obj","");
        boost::filesystem::path::replace_extension(&outputfile);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_ca4,_outimg) != &local_c98) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_ca4,_outimg),
                          CONCAT44(local_c98._M_allocated_capacity._4_4_,
                                   local_c98._M_allocated_capacity._0_4_) + 1);
        }
        std::vector<float,_std::allocator<float>_>::vector(&local_920,&pca_shape_coefficients);
        local_798.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_798.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_798.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        eos::morphablemodel::MorphableModel::draw_sample
                  ((Mesh *)&outimg,&morphable_model,&local_920,&local_798);
        local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_898,outputfile.m_pathname._M_dataplus._M_p,
                   outputfile.m_pathname._M_dataplus._M_p + outputfile.m_pathname._M_string_length);
        eos::core::write_textured_obj((Mesh *)&outimg,&local_898);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_898._M_dataplus._M_p != &local_898.field_2) {
          operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
        }
        if (local_c30 != (pointer)0x0) {
          operator_delete(local_c30,(long)local_c20 - (long)local_c30);
        }
        if (local_c48 != (pointer)0x0) {
          operator_delete(local_c48,(long)local_c38 - (long)local_c48);
        }
        if (local_c60 != (pointer)0x0) {
          operator_delete(local_c60,(long)local_c50 - (long)local_c60);
        }
        pvVar10 = (void *)CONCAT44(uStack_c74,uStack_c78);
        if (pvVar10 != (void *)0x0) {
          operator_delete(pvVar10,(long)local_c68 - (long)pvVar10);
        }
        if ((void *)local_c98._8_8_ != (void *)0x0) {
          operator_delete((void *)local_c98._8_8_,CONCAT44(uStack_c7c,local_c80) - local_c98._8_8_);
        }
        pvVar10 = (void *)CONCAT44(uStack_ca4,_outimg);
        if (pvVar10 != (void *)0x0) {
          operator_delete(pvVar10,CONCAT44(local_c98._M_allocated_capacity._4_4_,
                                           local_c98._M_allocated_capacity._0_4_) - (long)pvVar10);
        }
        if (local_798.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_798.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_798.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_798.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_920.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_920.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_920.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_920.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Finished fitting and wrote result mesh and texture to files with basename ",0x4a
                  );
        _outimg = (uint)&local_c98;
        uStack_ca4 = (undefined4)((ulong)&local_c98 >> 0x20);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&outimg,outputfilebase.m_pathname._M_dataplus._M_p,
                   outputfilebase.m_pathname._M_dataplus._M_p +
                   outputfilebase.m_pathname._M_string_length);
        pbVar21 = boost::io::detail::
                  quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
                            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &outimg,'&','\"');
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_ca4,_outimg) != &local_c98) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_ca4,_outimg),
                          CONCAT44(local_c98._M_allocated_capacity._4_4_,
                                   local_c98._M_allocated_capacity._0_4_) + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(pbVar21,".",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)pbVar21 + -0x18) + (char)pbVar21);
        std::ostream::put((char)pbVar21);
        std::ostream::flush();
        if (frontal_rendering.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(frontal_rendering.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)frontal_rendering.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)frontal_rendering.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (neutral_expression.tti.
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(neutral_expression.tti.
                          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)neutral_expression.tti.
                                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)neutral_expression.tti.
                                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (neutral_expression.tci.
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(neutral_expression.tci.
                          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)neutral_expression.tci.
                                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)neutral_expression.tci.
                                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (neutral_expression.tvi.
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(neutral_expression.tvi.
                          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)neutral_expression.tvi.
                                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)neutral_expression.tvi.
                                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (neutral_expression.texcoords.
            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(neutral_expression.texcoords.
                          super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)neutral_expression.texcoords.
                                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)neutral_expression.texcoords.
                                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (neutral_expression.colors.
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(neutral_expression.colors.
                          super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)neutral_expression.colors.
                                super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)neutral_expression.colors.
                                super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (neutral_expression.vertices.
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(neutral_expression.vertices.
                          super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)neutral_expression.vertices.
                                super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)neutral_expression.vertices.
                                super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)outputfile.m_pathname._M_dataplus._M_p != paVar5) {
          operator_delete(outputfile.m_pathname._M_dataplus._M_p,
                          outputfile.m_pathname.field_2._M_allocated_capacity + 1);
        }
        cv::Mat::~Mat(&merged_texturemap);
        cv::Mat::~Mat(&texturemap_averaging.merged_isomap);
        cv::Mat::~Mat(&texturemap_averaging.visibility_counter);
        std::
        vector<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
        ::~vector(&fitted_image_points);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::~vector(&blendshape_coefficients);
        if (pca_shape_coefficients.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(pca_shape_coefficients.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)pca_shape_coefficients.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)pca_shape_coefficients.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (image_widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(image_widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)image_widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)image_widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (per_frame_rendering_params.
            super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(per_frame_rendering_params.
                          super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)per_frame_rendering_params.
                                super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)per_frame_rendering_params.
                                super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>::~vector(&per_frame_meshes);
        if (edge_topology.adjacent_vertices.
            super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(edge_topology.adjacent_vertices.
                          super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)edge_topology.adjacent_vertices.
                                super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)edge_topology.adjacent_vertices.
                                super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (edge_topology.adjacent_faces.
            super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(edge_topology.adjacent_faces.
                          super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)edge_topology.adjacent_faces.
                                super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)edge_topology.adjacent_faces.
                                super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&ibug_contour.left_contour);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&ibug_contour.right_contour);
        if (local_738.left_contour.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_738.left_contour.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_738.left_contour.super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_738.left_contour.super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_738.right_contour.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_738.right_contour.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_738.right_contour.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_738.right_contour.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::
        vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>::
        ~vector(&blendshapes);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&landmark_mapper);
        iVar22 = 0;
        eos::morphablemodel::MorphableModel::~MorphableModel(&morphable_model);
        std::
        vector<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
        ::~vector(&per_frame_landmarks);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&images);
        goto LAB_0010de6c;
      }
      poVar19 = (ostream *)&std::cout;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Please give at least 1 image and landmark file.",0x2f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Number of landmarks files not equal to number of images given: ",0x3f);
      poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"!=",2);
      poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
    }
    std::ostream::put((char)poVar19);
    iVar22 = 1;
    std::ostream::flush();
  }
LAB_0010de6c:
  std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::~vector
            (&landmarksfiles);
  std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::~vector
            (&imagefiles);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputfilebase.m_pathname._M_dataplus._M_p != &outputfilebase.m_pathname.field_2) {
    operator_delete(outputfilebase.m_pathname._M_dataplus._M_p,
                    CONCAT71(outputfilebase.m_pathname.field_2._M_allocated_capacity._1_7_,
                             outputfilebase.m_pathname.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)blendshapesfile.m_pathname._M_dataplus._M_p != &blendshapesfile.m_pathname.field_2) {
    operator_delete(blendshapesfile.m_pathname._M_dataplus._M_p,
                    CONCAT71(blendshapesfile.m_pathname.field_2._M_allocated_capacity._1_7_,
                             blendshapesfile.m_pathname.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)edgetopologyfile.m_pathname._M_dataplus._M_p != &edgetopologyfile.m_pathname.field_2) {
    operator_delete(edgetopologyfile.m_pathname._M_dataplus._M_p,
                    CONCAT71(edgetopologyfile.m_pathname.field_2._M_allocated_capacity._1_7_,
                             edgetopologyfile.m_pathname.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)contourfile.m_pathname._M_dataplus._M_p != &contourfile.m_pathname.field_2) {
    operator_delete(contourfile.m_pathname._M_dataplus._M_p,
                    CONCAT71(contourfile.m_pathname.field_2._M_allocated_capacity._1_7_,
                             contourfile.m_pathname.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mappingsfile.m_pathname._M_dataplus._M_p != &mappingsfile.m_pathname.field_2) {
    operator_delete(mappingsfile.m_pathname._M_dataplus._M_p,
                    CONCAT71(mappingsfile.m_pathname.field_2._M_allocated_capacity._1_7_,
                             mappingsfile.m_pathname.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)modelfile.m_pathname._M_dataplus._M_p != &modelfile.m_pathname.field_2) {
    operator_delete(modelfile.m_pathname._M_dataplus._M_p,
                    CONCAT71(modelfile.m_pathname.field_2._M_allocated_capacity._1_7_,
                             modelfile.m_pathname.field_2._M_local_buf[0]) + 1);
  }
  return iVar22;
}

Assistant:

int main(int argc, char *argv[])
{
    // Note: Could make these all std::string, see fit-model.cpp.
    fs::path modelfile, mappingsfile, contourfile, edgetopologyfile, blendshapesfile, outputfilebase;
    vector<fs::path> imagefiles, landmarksfiles;
    try
    {
        po::options_description desc("Allowed options");
        // clang-format off
        desc.add_options()
            ("help,h", "display the help message")
            ("model,m", po::value<fs::path>(&modelfile)->required()->default_value("../share/sfm_shape_3448.bin"),
                "a Morphable Model stored as cereal BinaryArchive")
            ("image,i", po::value<vector<fs::path>>(&imagefiles)->multitoken(),
                "an input image")
            ("landmarks,l", po::value<vector<fs::path>>(&landmarksfiles)->multitoken(),
                "2D landmarks for the image, in ibug .pts format")
            ("mapping,p", po::value<fs::path>(&mappingsfile)->required()->default_value("../share/ibug_to_sfm.txt"),
                "landmark identifier to model vertex number mapping")
            ("model-contour,c", po::value<fs::path>(&contourfile)->required()->default_value("../share/model_contours.json"),
                "file with model contour indices")
            ("edge-topology,e", po::value<fs::path>(&edgetopologyfile)->required()->default_value("../share/sfm_3448_edge_topology.json"),
                "file with model's precomputed edge topology")
            ("blendshapes,b", po::value<fs::path>(&blendshapesfile)->required()->default_value("../share/expression_blendshapes_3448.bin"),
                "file with blendshapes")
            ("output,o", po::value<fs::path>(&outputfilebase)->required()->default_value("out"),
                "basename for the output rendering and obj files");
        // clang-format on
        po::variables_map vm;
        po::store(po::command_line_parser(argc, argv).options(desc).run(), vm);
        if (vm.count("help"))
        {
            cout << "Usage: fit-model-multi [options]" << endl;
            cout << desc;
            return EXIT_SUCCESS;
        }
        po::notify(vm);
    } catch (const po::error& e)
    {
        cout << "Error while parsing command-line arguments: " << e.what() << endl;
        cout << "Use --help to display a list of options." << endl;
        return EXIT_FAILURE;
    }

    if (landmarksfiles.size() != imagefiles.size()) {
        cout << "Number of landmarks files not equal to number of images given: " << landmarksfiles.size()
             << "!=" << imagefiles.size() << endl;
        return EXIT_FAILURE;
    }

    if (landmarksfiles.empty()) {
        cout << "Please give at least 1 image and landmark file." << endl;
        return EXIT_FAILURE;
    }
    // Load the image, landmarks, LandmarkMapper and the Morphable Model:
    vector<Mat> images;
    for (const auto& imagefile : imagefiles){
        images.push_back(cv::imread(imagefile.string()));
    }
    vector<LandmarkCollection<Eigen::Vector2f>> per_frame_landmarks;
    try
    {
        for (const auto& landmarksfile : landmarksfiles)
        {
            per_frame_landmarks.push_back(core::read_pts_landmarks(landmarksfile.string()));
        }
    } catch (const std::runtime_error& e)
    {
        cout << "Error reading the landmarks: " << e.what() << endl;
        return EXIT_FAILURE;
    }
    morphablemodel::MorphableModel morphable_model;
    try
    {
        morphable_model = morphablemodel::load_model(modelfile.string());
    } catch (const std::runtime_error& e)
    {
        cout << "Error loading the Morphable Model: " << e.what() << endl;
        return EXIT_FAILURE;
    }
    // The landmark mapper is used to map ibug landmark identifiers to vertex ids:
    core::LandmarkMapper landmark_mapper =
        mappingsfile.empty() ? core::LandmarkMapper() : core::LandmarkMapper(mappingsfile.string());

    // The expression blendshapes:
    vector<morphablemodel::Blendshape> blendshapes =
        morphablemodel::load_blendshapes(blendshapesfile.string());

    // These two are used to fit the front-facing contour to the ibug contour landmarks:
    fitting::ModelContour model_contour =
        contourfile.empty() ? fitting::ModelContour() : fitting::ModelContour::load(contourfile.string());
    fitting::ContourLandmarks ibug_contour = fitting::ContourLandmarks::load(mappingsfile.string());

    // The edge topology is used to speed up computation of the occluding face contour fitting:
    morphablemodel::EdgeTopology edge_topology =
        morphablemodel::load_edge_topology(edgetopologyfile.string());

    // Fit the model, get back a mesh and the pose:
    vector<core::Mesh> per_frame_meshes;
    vector<fitting::RenderingParameters> per_frame_rendering_params;
    vector<int> image_widths;
    vector<int> image_heights;
    for (const auto& image : images)
    {
        image_widths.push_back(image.cols);
        image_heights.push_back(image.rows);
    }

    vector<float> pca_shape_coefficients;
    vector<vector<float>> blendshape_coefficients;
    vector<vector<Eigen::Vector2f>> fitted_image_points;

    std::tie(per_frame_meshes, per_frame_rendering_params) = fitting::fit_shape_and_pose(
        morphable_model, blendshapes, per_frame_landmarks, landmark_mapper, image_widths, image_heights, edge_topology,
        ibug_contour, model_contour, 5, cpp17::nullopt, 30.0f, cpp17::nullopt, pca_shape_coefficients,
        blendshape_coefficients, fitted_image_points);

    cout << "Final pca shape coefficients: ";
    for (auto i : pca_shape_coefficients)
    {
        cout << i << ' ';
    }
    cout << endl;

    WeightedIsomapAveraging texturemap_averaging(60.f); // merge all triangles that are facing <60° towards the camera
    Mat merged_texturemap;
    for (unsigned i = 0; i < images.size(); ++i)
    {
        // The 3D head pose can be recovered as follows - the function returns an Eigen::Vector3f with yaw,
        // pitch, and roll angles:
        const float yaw_angle = per_frame_rendering_params[i].get_yaw_pitch_roll()[0];

        // Extract the texture from the image using given mesh and camera parameters:
        // Have to fiddle around with converting between core::Image and cv::Mat
        const core::Image4u texturemap = render::extract_texture(
            per_frame_meshes[i], per_frame_rendering_params[i].get_modelview(),
            per_frame_rendering_params[i].get_projection(), render::ProjectionType::Orthographic,
            core::from_mat_with_alpha(images[i]));

        // Draw the loaded landmarks:
        Mat outimg = images[i].clone();
        for (const auto& lm : per_frame_landmarks[i])
        {
            cv::rectangle(outimg, cv::Point2f(lm.coordinates[0] - 2.0f, lm.coordinates[1] - 2.0f),
                          cv::Point2f(lm.coordinates[0] + 2.0f, lm.coordinates[1] + 2.0f), {255, 0, 0});
        }

        // Draw the fitted mesh as wireframe, and save the image:
        render::draw_wireframe(outimg, per_frame_meshes[i], per_frame_rendering_params[i].get_modelview(),
                               per_frame_rendering_params[i].get_projection(),
                               fitting::get_opencv_viewport(images[i].cols, images[i].rows));
        fs::path outputfile = outputfilebase;
        outputfile += fs::path(imagefiles[i].stem());
        outputfile += fs::path(".png");
        cv::imwrite(outputfile.string(), outimg);

        // Save frontal rendering with texture:
        Eigen::Matrix4f modelview_frontal = Eigen::Matrix4f::Identity();
        core::Mesh neutral_expression = morphablemodel::sample_to_mesh(
            morphable_model.get_shape_model().draw_sample(pca_shape_coefficients),
            morphable_model.get_color_model().get_mean(),
            morphable_model.get_shape_model().get_triangle_list(),
            morphable_model.get_color_model().get_triangle_list(), morphable_model.get_texture_coordinates());
        const core::Image4u frontal_rendering = render::render(
            neutral_expression, modelview_frontal, render::ortho(-130.0f, 130.0f, -130.0f, 130.0f), 256, 256,
            render::create_mipmapped_texture(texturemap), true, false, false);
        outputfile.replace_extension(".frontal.png");
        cv::imwrite(outputfile.string(), core::to_mat(frontal_rendering));
        outputfile.replace_extension("");

        cv::Mat texturemap_opencv = core::to_mat(texturemap);

        // And save the texture map:
        outputfile.replace_extension(".texture.png");
        cv::imwrite(outputfile.string(), texturemap_opencv);

        // Merge the texture maps:
        merged_texturemap = texturemap_averaging.add_and_merge(texturemap_opencv);
    }

    // Save the merged texture map:
    fs::path outputfile = outputfilebase;
    outputfile += fs::path("merged.texture.png");
    cv::imwrite(outputfile.string(), merged_texturemap);
    outputfile.replace_extension("");

    // Save the frontal rendering with merged texture:
    Eigen::Matrix4f modelview_frontal = Eigen::Matrix4f::Identity();
    core::Mesh neutral_expression = morphablemodel::sample_to_mesh(
        morphable_model.get_shape_model().draw_sample(pca_shape_coefficients),
        morphable_model.get_color_model().get_mean(), morphable_model.get_shape_model().get_triangle_list(),
        morphable_model.get_color_model().get_triangle_list(), morphable_model.get_texture_coordinates());
    const core::Image4u frontal_rendering = render::render(
        neutral_expression, modelview_frontal, render::ortho(-130.0f, 130.0f, -130.0f, 130.0f), 512, 512,
        render::create_mipmapped_texture(core::from_mat_with_alpha(merged_texturemap)), true, false, false);
    outputfile.replace_extension(".frontal.png");
    cv::imwrite(outputfile.string(), core::to_mat(frontal_rendering));
    outputfile.replace_extension("");

    // Save the mesh as textured obj:
    outputfile.replace_extension(".obj");
    core::write_textured_obj(morphable_model.draw_sample(pca_shape_coefficients, std::vector<float>()),
                             outputfile.string());

    cout << "Finished fitting and wrote result mesh and texture to files with basename " << outputfilebase
         << "." << endl;

    return EXIT_SUCCESS;
}